

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

void sylvan_serialize_tofile(FILE *out)

{
  atomic<unsigned_int> var;
  avl_iter_t *iter;
  sylvan_ser *psVar1;
  uint64_t uVar2;
  size_t low;
  size_t high;
  bool bVar3;
  undefined1 local_48 [8];
  mtbddnode node;
  mtbddnode_t n;
  size_t index;
  avl_iter_t *it;
  sylvan_ser *s;
  size_t count;
  FILE *out_local;
  
  count = (size_t)out;
  s = (sylvan_ser *)avl_count(sylvan_ser_reversed_set);
  if (s < sylvan_ser_done) {
    __assert_fail("count >= sylvan_ser_done",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                  ,0x8d5,"void sylvan_serialize_tofile(FILE *)");
  }
  if (s != (sylvan_ser *)(sylvan_ser_counter - 1)) {
    __assert_fail("count == sylvan_ser_counter-1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                  ,0x8d6,"void sylvan_serialize_tofile(FILE *)");
  }
  s = (sylvan_ser *)((long)s - sylvan_ser_done);
  fwrite(&s,8,1,(FILE *)count);
  iter = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
  n = (mtbddnode_t)0x0;
  while( true ) {
    bVar3 = false;
    if (n < sylvan_ser_done) {
      it = (avl_iter_t *)sylvan_ser_reversed_iter_next(iter);
      bVar3 = (sylvan_ser *)it != (sylvan_ser *)0x0;
    }
    if (!bVar3) break;
    n = (mtbddnode_t)((long)&n->a + 1);
    if ((mtbddnode_t)it[1].height != n) {
      __assert_fail("s->assigned == index",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                    ,0x8e1,"void sylvan_serialize_tofile(FILE *)");
    }
  }
  while( true ) {
    psVar1 = sylvan_ser_reversed_iter_next(iter);
    if (psVar1 == (sylvan_ser *)0x0) {
      sylvan_ser_done = sylvan_ser_counter - 1;
      sylvan_ser_reversed_iter_free(iter);
      return;
    }
    n = (mtbddnode_t)((long)&n->a + 1);
    if ((mtbddnode_t)psVar1->assigned != n) break;
    node.b = (uint64_t)MTBDD_GETNODE(psVar1->bdd);
    var = mtbddnode_getvariable((mtbddnode_t)node.b);
    uVar2 = mtbddnode_getlow((mtbddnode_t)node.b);
    low = sylvan_serialize_get(uVar2);
    uVar2 = mtbddnode_gethigh((mtbddnode_t)node.b);
    high = sylvan_serialize_get(uVar2);
    mtbddnode_makenode((mtbddnode_t)local_48,var,low,high);
    fwrite(local_48,0x10,1,(FILE *)count);
  }
  __assert_fail("s->assigned == index",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                ,0x8e6,"void sylvan_serialize_tofile(FILE *)");
}

Assistant:

void
sylvan_serialize_tofile(FILE *out)
{
    size_t count = avl_count(sylvan_ser_reversed_set);
    assert(count >= sylvan_ser_done);
    assert(count == sylvan_ser_counter-1);
    count -= sylvan_ser_done;
    fwrite(&count, sizeof(size_t), 1, out);

    struct sylvan_ser *s;
    avl_iter_t *it = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);

    /* Skip already written entries */
    size_t index = 0;
    while (index < sylvan_ser_done && (s=sylvan_ser_reversed_iter_next(it))) {
        index++;
        assert(s->assigned == index);
    }

    while ((s=sylvan_ser_reversed_iter_next(it))) {
        index++;
        assert(s->assigned == index);

        bddnode_t n = MTBDD_GETNODE(s->bdd);

        struct bddnode node;
        bddnode_makenode(&node, bddnode_getvariable(n), sylvan_serialize_get(bddnode_getlow(n)), sylvan_serialize_get(bddnode_gethigh(n)));

        fwrite(&node, sizeof(struct bddnode), 1, out);
    }

    sylvan_ser_done = sylvan_ser_counter-1;
    sylvan_ser_reversed_iter_free(it);
}